

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserFontEffect.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserFontEffect::ParseValue
          (PropertyParserFontEffect *this,Property *property,String *font_effect_string_value,
          ParameterMap *param_3)

{
  NodePtr pDVar1;
  element_type *peVar2;
  pointer pbVar3;
  pointer psVar4;
  size_type sVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  FontEffectInstancer *this_00;
  PropertySpecification *this_01;
  PropertyMap *this_02;
  char *__it;
  long lVar9;
  long lVar10;
  _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::__0>
  *this_03;
  pointer pbVar11;
  __normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
  _Var12;
  SharedPtr<FontEffect> font_effect;
  size_t fingerprint;
  String type;
  PropertyDictionary properties;
  StringList font_effect_string_list;
  const_iterator __begin4;
  String shorthand;
  FontEffects font_effects;
  String local_50;
  
  if ((font_effect_string_value->_M_string_length == 0) ||
     (bVar6 = ::std::operator==(font_effect_string_value,"none"), bVar6)) {
    Variant::Variant((Variant *)&font_effects);
    Variant::operator=(&property->value,(Variant *)&font_effects);
    Variant::~Variant((Variant *)&font_effects);
    property->unit = UNKNOWN;
    return true;
  }
  font_effects.value._M_dataplus._M_p = (pointer)&font_effects.value.field_2;
  font_effects.list.
  super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  font_effects.list.
  super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  font_effects.list.
  super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  font_effects.value._M_string_length = 0;
  font_effects.value.field_2._M_local_buf[0] = '\0';
  font_effect_string_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  font_effect_string_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  font_effect_string_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StringUtilities::ExpandString(&font_effect_string_list,font_effect_string_value,',','(',')',false)
  ;
  ::std::__cxx11::string::_M_assign((string *)&font_effects.value);
  __it = (char *)((long)font_effect_string_list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)font_effect_string_list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  ::std::
  vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
  ::reserve(&font_effects.list,(size_type)__it);
  pbVar3 = font_effect_string_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = font_effect_string_list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = font_effects.list.
               super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, pbVar11 != pbVar3; pbVar11 = pbVar11 + 1)
  {
    uVar7 = ::std::__cxx11::string::find((char)pbVar11,0x28);
    uVar8 = ::std::__cxx11::string::rfind((char)pbVar11,0x29);
    if ((uVar8 <= uVar7) || (uVar8 == 0xffffffffffffffff)) {
      bVar6 = false;
      Log::Message(LT_WARNING,"Invalid syntax for font-effect \'%s\'.",(pbVar11->_M_dataplus)._M_p);
      goto LAB_002b7d55;
    }
    ::std::__cxx11::string::substr((ulong)&properties,(ulong)pbVar11);
    StringUtilities::StripWhitespace(&type,(String *)&properties);
    ::std::__cxx11::string::~string((string *)&properties);
    this_00 = Factory::GetFontEffectInstancer(&type);
    if (this_00 == (FontEffectInstancer *)0x0) {
      Log::Message(LT_WARNING,"Font-effect type \'%s\' not found.",type._M_dataplus._M_p);
LAB_002b7d49:
      ::std::__cxx11::string::~string((string *)&type);
      goto LAB_002b7d53;
    }
    ::std::__cxx11::string::substr((ulong)&shorthand,(ulong)pbVar11);
    this_01 = FontEffectInstancer::GetPropertySpecification(this_00);
    PropertyDictionary::PropertyDictionary(&properties);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"font-effect",(allocator<char> *)&font_effect);
    bVar6 = PropertySpecification::ParsePropertyDeclaration
                      (this_01,&properties,&local_50,&shorthand);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (!bVar6) {
      StringUtilities::StripWhitespace(&local_50,&shorthand);
      sVar5 = local_50._M_string_length;
      ::std::__cxx11::string::~string((string *)&local_50);
      if (sVar5 != 0) {
        Log::Message(LT_WARNING,"Could not parse font-effect value \'%s\'.",
                     (pbVar11->_M_dataplus)._M_p);
        robin_hood::detail::
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::destroy(&properties.properties);
        ::std::__cxx11::string::~string((string *)&shorthand);
        goto LAB_002b7d49;
      }
    }
    PropertySpecification::SetPropertyDefaults(this_01,&properties);
    (*this_00->_vptr_FontEffectInstancer[2])(&font_effect,this_00,&type,&properties);
    peVar2 = font_effect.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (font_effect.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __it = "Font-effect \'%s\' could not be instanced.";
      Log::Message(LT_WARNING,"Font-effect \'%s\' could not be instanced.",
                   (pbVar11->_M_dataplus)._M_p);
    }
    else {
      fingerprint = ::std::
                    hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_50,&type);
      this_02 = PropertyDictionary::GetProperties(&properties);
      __begin4 = robin_hood::detail::
                 Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 ::cbegin(this_02);
      pDVar1 = (NodePtr)this_02->mInfo;
      while (__begin4.mKeyVals != pDVar1) {
        Property::Get<std::__cxx11::string>(&local_50,&((__begin4.mKeyVals)->mData).second);
        Utilities::HashCombine<std::__cxx11::string>(&fingerprint,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        robin_hood::detail::
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::Iter<true>::operator++(&__begin4);
      }
      FontEffect::SetFingerprint
                (font_effect.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 fingerprint);
      __it = (char *)&font_effect;
      ::std::
      vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>
      ::emplace_back<std::shared_ptr<Rml::FontEffect>>
                ((vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>
                  *)&font_effects,(shared_ptr<Rml::FontEffect> *)__it);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&font_effect.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::destroy(&properties.properties);
    ::std::__cxx11::string::~string((string *)&shorthand);
    ::std::__cxx11::string::~string((string *)&type);
    if (peVar2 == (element_type *)0x0) goto LAB_002b7d53;
  }
  if (font_effects.list.
      super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      font_effects.list.
      super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002b7d53:
    bVar6 = false;
    goto LAB_002b7d55;
  }
  lVar9 = (long)font_effects.list.
                super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)font_effects.list.
                super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this_03 = (_Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::__0>
             *)font_effects.list.
               super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  for (lVar10 = lVar9 >> 6; _Var12._M_current = (shared_ptr<const_Rml::FontEffect> *)this_03,
      0 < lVar10; lVar10 = lVar10 + -1) {
    bVar6 = __gnu_cxx::__ops::
            _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
            ::operator()(this_03,(__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                                  )__it);
    if (bVar6) goto LAB_002b7dc2;
    bVar6 = __gnu_cxx::__ops::
            _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
            ::operator()(this_03 + 0x10,
                         (__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                          )__it);
    _Var12._M_current = (shared_ptr<const_Rml::FontEffect> *)(this_03 + 0x10);
    if (bVar6) goto LAB_002b7dc2;
    bVar6 = __gnu_cxx::__ops::
            _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
            ::operator()(this_03 + 0x20,
                         (__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                          )__it);
    _Var12._M_current = (shared_ptr<const_Rml::FontEffect> *)(this_03 + 0x20);
    if (bVar6) goto LAB_002b7dc2;
    bVar6 = __gnu_cxx::__ops::
            _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
            ::operator()(this_03 + 0x30,
                         (__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                          )__it);
    _Var12._M_current = (shared_ptr<const_Rml::FontEffect> *)(this_03 + 0x30);
    if (bVar6) goto LAB_002b7dc2;
    this_03 = this_03 + 0x40;
    lVar9 = lVar9 + -0x40;
  }
  lVar9 = lVar9 >> 4;
  if (lVar9 == 1) {
LAB_002b7e6f:
    bVar6 = __gnu_cxx::__ops::
            _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
            ::operator()(this_03,(__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                                  )__it);
    _Var12._M_current = (shared_ptr<const_Rml::FontEffect> *)this_03;
    if (!bVar6) {
      _Var12._M_current = psVar4;
    }
LAB_002b7dc2:
    if (_Var12._M_current != psVar4) {
      ::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
                           *)&properties,_Var12,(long)psVar4 - (long)_Var12._M_current >> 4);
      ::std::
      __stable_partition_adaptive<__gnu_cxx::__normal_iterator<std::shared_ptr<Rml::FontEffect_const>*,std::vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>>,std::shared_ptr<Rml::FontEffect_const>*,__gnu_cxx::__ops::_Iter_pred<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::__0>,long>
                (_Var12._M_current,psVar4,properties.properties.mKeyVals,
                 properties.properties.mNumElements,properties.properties.mInfo);
      ::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
                  *)&properties);
    }
  }
  else {
    if (lVar9 == 2) {
LAB_002b7e59:
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
              ::operator()(this_03,(__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                                    )__it);
      _Var12._M_current = (shared_ptr<const_Rml::FontEffect> *)this_03;
      if (!bVar6) {
        this_03 = this_03 + 0x10;
        goto LAB_002b7e6f;
      }
      goto LAB_002b7dc2;
    }
    if (lVar9 == 3) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_negate<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::$_0>
              ::operator()(this_03,(__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
                                    )__it);
      if (!bVar6) {
        this_03 = this_03 + 0x10;
        goto LAB_002b7e59;
      }
      goto LAB_002b7dc2;
    }
  }
  ::std::make_shared<Rml::FontEffects,Rml::FontEffects>((FontEffects *)&type);
  Variant::Variant<std::shared_ptr<Rml::FontEffects>,void>
            ((Variant *)&properties,(shared_ptr<Rml::FontEffects> *)&type);
  Variant::operator=(&property->value,(Variant *)&properties);
  Variant::~Variant((Variant *)&properties);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&type._M_string_length);
  property->unit = FONTEFFECT;
  bVar6 = true;
LAB_002b7d55:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&font_effect_string_list);
  FontEffects::~FontEffects(&font_effects);
  return bVar6;
}

Assistant:

bool PropertyParserFontEffect::ParseValue(Property& property, const String& font_effect_string_value, const ParameterMap& /*parameters*/) const
{
	// Font-effects are declared as
	//   font-effect: <font-effect-value>[, <font-effect-value> ...];
	// Where <font-effect-value> is declared with inline properties, e.g.
	//   font-effect: outline( 1px black ), ...;

	if (font_effect_string_value.empty() || font_effect_string_value == "none")
	{
		property.value = Variant();
		property.unit = Unit::UNKNOWN;
		return true;
	}

	RMLUI_ZoneScoped;

	FontEffects font_effects;

	// Make sure we don't split inside the parenthesis since they may appear in decorator shorthands.
	StringList font_effect_string_list;
	StringUtilities::ExpandString(font_effect_string_list, font_effect_string_value, ',', '(', ')');

	font_effects.value = font_effect_string_value;
	font_effects.list.reserve(font_effect_string_list.size());

	// Get or instance each decorator in the comma-separated string list
	for (const String& font_effect_string : font_effect_string_list)
	{
		const size_t shorthand_open = font_effect_string.find('(');
		const size_t shorthand_close = font_effect_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);

		if (invalid_parenthesis)
		{
			// We found no parenthesis, font-effects can only be declared anonymously for now.
			Log::Message(Log::LT_WARNING, "Invalid syntax for font-effect '%s'.", font_effect_string.c_str());
			return false;
		}
		else
		{
			// Since we have parentheses it must be an anonymous decorator with inline properties
			const String type = StringUtilities::StripWhitespace(font_effect_string.substr(0, shorthand_open));

			// Check for valid font-effect type
			FontEffectInstancer* instancer = Factory::GetFontEffectInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Font-effect type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = font_effect_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'font-effect' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "font-effect", shorthand))
			{
				// Empty values are allowed in font-effects, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
				{
					Log::Message(Log::LT_WARNING, "Could not parse font-effect value '%s'.", font_effect_string.c_str());
					return false;
				}
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			RMLUI_ZoneScopedN("InstanceFontEffect");
			SharedPtr<FontEffect> font_effect = instancer->InstanceFontEffect(type, properties);
			if (font_effect)
			{
				// Create a unique hash value for the given type and values
				size_t fingerprint = Hash<String>{}(type);
				for (const auto& id_value : properties.GetProperties())
					Utilities::HashCombine(fingerprint, id_value.second.Get<String>());

				font_effect->SetFingerprint(fingerprint);

				font_effects.list.emplace_back(std::move(font_effect));
			}
			else
			{
				Log::Message(Log::LT_WARNING, "Font-effect '%s' could not be instanced.", font_effect_string.c_str());
				return false;
			}
		}
	}

	if (font_effects.list.empty())
		return false;

	// Partition the list such that the back layer effects appear before the front layer effects
	std::stable_partition(font_effects.list.begin(), font_effects.list.end(),
		[](const SharedPtr<const FontEffect>& effect) { return effect->GetLayer() == FontEffect::Layer::Back; });

	property.value = Variant(MakeShared<FontEffects>(std::move(font_effects)));
	property.unit = Unit::FONTEFFECT;

	return true;
}